

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

_Bool fy_node_compare_user
                (fy_node *fyn1,fy_node *fyn2,fy_node_mapping_sort_fn sort_fn,void *sort_fn_arg,
                fy_node_scalar_compare_fn cmp_fn,void *cmp_fn_arg)

{
  fy_token *pfVar1;
  fy_node_pair *pfVar2;
  fy_node_pair *pfVar3;
  fy_node *pfVar4;
  fy_node *pfVar5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  fy_token *fyn2_00;
  fy_token *fyn1_00;
  fy_token *pfVar12;
  code *pcVar13;
  fy_node_pair **fynpp;
  fy_node_pair **fynpp_00;
  uint count;
  bool bVar14;
  bool bVar15;
  fy_node_pair *apfStack_60 [2];
  fy_node_scalar_compare_fn local_50;
  void *local_48;
  fy_node_mapping_sort_fn local_40;
  fy_node *local_38;
  
  if (cmp_fn == (fy_node_scalar_compare_fn)0x0) {
    cmp_fn_arg = (void *)0x0;
  }
  pcVar13 = fy_node_scalar_cmp_default;
  if (cmp_fn != (fy_node_scalar_compare_fn)0x0) {
    pcVar13 = cmp_fn;
  }
  if (sort_fn == (fy_node_mapping_sort_fn)0x0) {
    sort_fn_arg = &local_50;
    local_50 = pcVar13;
    local_48 = cmp_fn_arg;
    sort_fn = fy_node_mapping_sort_cmp_default;
  }
  else {
    local_50 = (fy_node_scalar_compare_fn)0x0;
    local_48 = (void *)0x0;
  }
  if (fyn1 == fyn2) {
    return true;
  }
  bVar15 = true;
  bVar14 = true;
  if (fyn1 != (fy_node *)0x0) {
    if ((fyn1->field_0x34 & 3) == 0) {
      apfStack_60[0] = (fy_node_pair *)0x11d45c;
      local_40 = sort_fn;
      local_38 = fyn2;
      sVar10 = fy_token_get_text_length((fyn1->field_12).scalar);
      bVar14 = sVar10 == 0;
      fyn2 = local_38;
      sort_fn = local_40;
    }
    else {
      bVar14 = false;
    }
  }
  if (fyn2 == (fy_node *)0x0) {
LAB_0011d4a4:
    if ((bool)(bVar14 & bVar15)) {
      return true;
    }
  }
  else {
    if ((fyn2->field_0x34 & 3) == 0) {
      apfStack_60[0] = (fy_node_pair *)0x11d492;
      local_40 = sort_fn;
      local_38 = fyn2;
      sVar10 = fy_token_get_text_length((fyn2->field_12).scalar);
      bVar15 = sVar10 == 0;
      fyn2 = local_38;
      sort_fn = local_40;
      goto LAB_0011d4a4;
    }
    bVar15 = false;
  }
  if ((!bVar14 && !bVar15) && (bVar6 = fyn1->field_0x34 & 3, bVar6 == (fyn2->field_0x34 & 3))) {
    _Var7 = true;
    switch(bVar6) {
    case 0:
      if ((fyn2->style == FYNS_ALIAS) == (fyn1->style == FYNS_ALIAS)) {
        apfStack_60[0] = (fy_node_pair *)0x11d50a;
        iVar8 = (*pcVar13)(fyn1,fyn2,cmp_fn_arg);
        return iVar8 == 0;
      }
      break;
    case 1:
      pfVar12 = (fyn1->field_12).scalar;
      fyn1_00 = pfVar12;
      if (pfVar12 == (fy_token *)&fyn1->field_12) {
        fyn1_00 = (fy_token *)0x0;
      }
      pfVar1 = (fyn2->field_12).scalar;
      fyn2_00 = (fy_token *)0x0;
      if (pfVar1 != (fy_token *)&fyn2->field_12) {
        fyn2_00 = pfVar1;
      }
      if (fyn2_00 == (fy_token *)0x0 || fyn1_00 == (fy_token *)0x0) {
        _Var7 = true;
      }
      else {
        while( true ) {
          fyn1_00 = pfVar12;
          fyn2_00 = pfVar1;
          apfStack_60[0] = (fy_node_pair *)0x11d56b;
          _Var7 = fy_node_compare_user
                            ((fy_node *)fyn1_00,(fy_node *)fyn2_00,(fy_node_mapping_sort_fn)0x0,
                             (void *)0x0,(fy_node_scalar_compare_fn)0x0,(void *)0x0);
          if (!_Var7) break;
          pfVar12 = (fy_token *)(fyn1_00->node).next;
          fyn1_00 = pfVar12;
          if (pfVar12 == (fy_token *)&fyn1->field_12) {
            fyn1_00 = (fy_token *)0x0;
          }
          pfVar1 = (fy_token *)(fyn2_00->node).next;
          fyn2_00 = pfVar1;
          if (pfVar1 == (fy_token *)&fyn2->field_12) {
            fyn2_00 = (fy_token *)0x0;
          }
          if ((fyn1_00 == (fy_token *)0x0) || (fyn2_00 == (fy_token *)0x0)) break;
        }
      }
      return (_Bool)(fyn1_00 == fyn2_00 & _Var7);
    case 2:
      pfVar12 = (fyn1->field_12).scalar;
      uVar9 = 0;
      count = 0;
      if (pfVar12 != (fy_token *)0x0 && pfVar12 != (fy_token *)&fyn1->field_12) {
        count = 0;
        do {
          count = count + 1;
          pfVar12 = (fy_token *)(pfVar12->node).next;
          if (pfVar12 == (fy_token *)&fyn1->field_12) break;
        } while (pfVar12 != (fy_token *)0x0);
        if (fyn2 == (fy_node *)0x0) break;
      }
      pfVar12 = (fyn2->field_12).scalar;
      if (pfVar12 != (fy_token *)0x0 && pfVar12 != (fy_token *)&fyn2->field_12) {
        uVar9 = 0;
        do {
          uVar9 = uVar9 + 1;
          pfVar12 = (fy_token *)(pfVar12->node).next;
          if (pfVar12 == (fy_token *)&fyn2->field_12) break;
        } while (pfVar12 != (fy_token *)0x0);
      }
      if (count == uVar9) {
        uVar11 = (long)(int)count * 8 + 0x17U & 0xfffffffffffffff0;
        fynpp_00 = (fy_node_pair **)((long)apfStack_60 + (8 - uVar11));
        fynpp = (fy_node_pair **)((long)fynpp_00 - uVar11);
        local_38 = (fy_node *)sort_fn_arg;
        fynpp[-1] = (fy_node_pair *)0x11d657;
        fy_node_mapping_perform_sort(fyn1,sort_fn,sort_fn_arg,fynpp_00,count);
        pfVar4 = local_38;
        fynpp[-1] = (fy_node_pair *)0x11d66f;
        fy_node_mapping_perform_sort(fyn2,sort_fn,pfVar4,fynpp,count);
        if (0 < (int)count) {
          local_38 = (fy_node *)(ulong)count;
          uVar11 = 0;
          do {
            pfVar2 = fynpp_00[uVar11];
            pfVar3 = fynpp[uVar11];
            pfVar4 = pfVar2->key;
            pfVar5 = pfVar3->key;
            fynpp[-1] = (fy_node_pair *)0x11d69f;
            _Var7 = fy_node_compare_user
                              (pfVar4,pfVar5,(fy_node_mapping_sort_fn)0x0,(void *)0x0,
                               (fy_node_scalar_compare_fn)0x0,(void *)0x0);
            if (!_Var7) goto LAB_0011d6cc;
            pfVar4 = pfVar2->value;
            pfVar5 = pfVar3->value;
            fynpp[-1] = (fy_node_pair *)0x11d6bb;
            _Var7 = fy_node_compare_user
                              (pfVar4,pfVar5,(fy_node_mapping_sort_fn)0x0,(void *)0x0,
                               (fy_node_scalar_compare_fn)0x0,(void *)0x0);
            if (!_Var7) goto LAB_0011d6cc;
            uVar11 = uVar11 + 1;
          } while (local_38 != (fy_node *)uVar11);
        }
        return true;
      }
      break;
    case 3:
      goto switchD_0011d4e4_caseD_3;
    }
  }
LAB_0011d6cc:
  _Var7 = false;
switchD_0011d4e4_caseD_3:
  return _Var7;
}

Assistant:

bool fy_node_compare_user(struct fy_node *fyn1, struct fy_node *fyn2,
                          fy_node_mapping_sort_fn sort_fn, void *sort_fn_arg,
                          fy_node_scalar_compare_fn cmp_fn, void *cmp_fn_arg) {
    struct fy_node *fyni1, *fyni2;
    struct fy_node_pair *fynp1, *fynp2;
    bool ret, null1, null2;
    struct fy_node_pair **fynpp1, **fynpp2;
    int i, count1, count2;
    bool alias1, alias2;
    struct fy_node_cmp_arg def_arg;

    if (!cmp_fn) {
        cmp_fn = fy_node_scalar_cmp_default;
        cmp_fn_arg = NULL;
    }
    if (!sort_fn) {
        sort_fn = fy_node_mapping_sort_cmp_default;
        def_arg.cmp_fn = cmp_fn;
        def_arg.arg = cmp_fn_arg;
        sort_fn_arg = &def_arg;
    } else {
        def_arg.cmp_fn = NULL;
        def_arg.arg = NULL;
    }
    /* equal pointers? */
    if (fyn1 == fyn2)
        return true;

    null1 = !fyn1 || (fyn1->type == FYNT_SCALAR && fy_token_get_text_length(fyn1->scalar) == 0);
    null2 = !fyn2 || (fyn2->type == FYNT_SCALAR && fy_token_get_text_length(fyn2->scalar) == 0);

    /* both null */
    if (null1 && null2)
        return true;

    /* either is NULL, no match */
    if (null1 || null2)
        return false;

    /* types must match */
    if (fyn1->type != fyn2->type)
        return false;

    ret = true;

    switch (fyn1->type) {
        case FYNT_SEQUENCE:
            fyni1 = fy_node_list_head(&fyn1->sequence);
            fyni2 = fy_node_list_head(&fyn2->sequence);
            while (fyni1 && fyni2) {

                ret = fy_node_compare(fyni1, fyni2);
                if (!ret)
                    break;

                fyni1 = fy_node_next(&fyn1->sequence, fyni1);
                fyni2 = fy_node_next(&fyn2->sequence, fyni2);
            }
            if (ret && fyni1 != fyni2 && (!fyni1 || !fyni2))
                ret = false;

            break;

        case FYNT_MAPPING:
            count1 = fy_node_mapping_item_count(fyn1);
            count2 = fy_node_mapping_item_count(fyn2);

            /* mapping counts must match */
            if (count1 != count2) {
                ret = false;
                break;
            }

            fynpp1 = alloca(sizeof(*fynpp1) * (count1 + 1));
            fynpp2 = alloca(sizeof(*fynpp2) * (count2 + 1));

            fy_node_mapping_perform_sort(fyn1, sort_fn, sort_fn_arg, fynpp1, count1);
            fy_node_mapping_perform_sort(fyn2, sort_fn, sort_fn_arg, fynpp2, count2);

            for (i = 0; i < count1; i++) {
                fynp1 = fynpp1[i];
                fynp2 = fynpp2[i];

                ret = fy_node_compare(fynp1->key, fynp2->key);
                if (!ret)
                    break;

                ret = fy_node_compare(fynp1->value, fynp2->value);
                if (!ret)
                    break;
            }
            if (i >= count1)
                ret = true;

            break;

        case FYNT_SCALAR:
            alias1 = fy_node_is_alias(fyn1);
            alias2 = fy_node_is_alias(fyn2);

            /* either both must be aliases or both not */
            if (alias1 != alias2)
                return false;

            ret = !cmp_fn(fyn1, fyn2, cmp_fn_arg);
            break;
    }

    return ret;
}